

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetStabilityFn(void *arkode_mem,ARKExpStabFn EStab,void *estab_data)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  ARKodeMem ark_mem;
  ARKodeHAdaptMem hadapt_mem;
  int retval;
  ARKodeMem in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  local_4 = arkAccessHAdaptMem((void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                               ,in_stack_ffffffffffffffd0,(ARKodeMem *)in_stack_ffffffffffffffc8,
                               (ARKodeHAdaptMem *)0x15ce4c);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffc8->step_supports_adaptive == 0) {
      arkProcessError(in_stack_ffffffffffffffc8,-0x30,0x7fe,"ARKodeSetStabilityFn",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                      ,"time-stepping module does not support temporal adaptivity");
      local_4 = -0x30;
    }
    else {
      *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x78) = in_RSI;
      *(undefined8 *)(in_stack_ffffffffffffffd0 + 0x80) = in_RDX;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetStabilityFn(void* arkode_mem, ARKExpStabFn EStab, void* estab_data)
{
  int retval;
  ARKodeHAdaptMem hadapt_mem;
  ARKodeMem ark_mem;
  retval = arkAccessHAdaptMem(arkode_mem, __func__, &ark_mem, &hadapt_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Guard against use for non-adaptive time stepper modules */
  if (!ark_mem->step_supports_adaptive)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support temporal adaptivity");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* NULL argument sets default, otherwise set inputs */
  hadapt_mem->expstab    = EStab;
  hadapt_mem->estab_data = estab_data;

  return (ARK_SUCCESS);
}